

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O2

int PEM_write_RSA_PUBKEY(FILE *fp,RSA *x)

{
  int iVar1;
  
  iVar1 = PEM_ASN1_write(pem_write_RSA_PUBKEY_i2d,"PUBLIC KEY",fp,x,(EVP_CIPHER *)0x0,(uchar *)0x0,0
                         ,(undefined1 *)0x0,(void *)0x0);
  return iVar1;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}